

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

StoreRegKind get_storage3(DisasContext_conflict1 *s,int rd,int rn,int *as)

{
  if ((rd != 0xf) || (*as == 0)) {
    return (rn == 0xd && rd == 0xd) + STREG_NORMAL;
  }
  if ((s->user == 0) && (s->current_el != 2)) {
    *as = 0;
    return STREG_EXC_RET;
  }
  unallocated_encoding_aarch64(s);
  return STREG_NORMAL;
}

Assistant:

static StoreRegKind get_storage3(DisasContext *s, int rd, int rn, int *as)
{
    StoreRegKind ret = STREG_NORMAL;
    if (rd == 15 && *as) {
        /*
         * See ALUExceptionReturn:
         * In User mode, UNPREDICTABLE; we choose UNDEF.
         * In Hyp mode, UNDEFINED.
         */
        if (IS_USER(s) || s->current_el == 2) {
            unallocated_encoding(s);
            return true;
        }
        /* There is no writeback of nzcv to PSTATE.  */
        *as = 0;
        ret = STREG_EXC_RET;
    } else if (rd == 13 && rn == 13) {
        ret = STREG_SP_CHECK;
    }

    return ret;
}